

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O3

void readcb(bufferevent *bev,void *ptr)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  
  uVar2 = bufferevent_get_input();
  uVar3 = evbuffer_get_length(uVar2);
  uVar4 = evbuffer_pullup(uVar2,0xffffffffffffffff);
  uVar5 = nghttp2_session_mem_recv2(*ptr,uVar4,uVar3);
  if ((long)uVar5 < 0) {
    uVar2 = nghttp2_strerror(uVar5 & 0xffffffff);
    warnx("Fatal error: %s",uVar2);
  }
  else {
    iVar1 = evbuffer_drain(uVar2,uVar5);
    if (iVar1 == 0) {
      iVar1 = session_send(*ptr);
      if (iVar1 == 0) {
        return;
      }
    }
    else {
      warnx("Fatal error: evbuffer_drain failed");
    }
  }
  delete_http2_session_data((http2_session_data *)ptr);
  return;
}

Assistant:

static void readcb(struct bufferevent *bev, void *ptr) {
  http2_session_data *session_data = (http2_session_data *)ptr;
  nghttp2_ssize readlen;
  struct evbuffer *input = bufferevent_get_input(bev);
  size_t datalen = evbuffer_get_length(input);
  unsigned char *data = evbuffer_pullup(input, -1);

  readlen = nghttp2_session_mem_recv2(session_data->session, data, datalen);
  if (readlen < 0) {
    warnx("Fatal error: %s", nghttp2_strerror((int)readlen));
    delete_http2_session_data(session_data);
    return;
  }
  if (evbuffer_drain(input, (size_t)readlen) != 0) {
    warnx("Fatal error: evbuffer_drain failed");
    delete_http2_session_data(session_data);
    return;
  }
  if (session_send(session_data) != 0) {
    delete_http2_session_data(session_data);
    return;
  }
}